

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
RunScriptWithParserStateCore
          (DWORD dwBgParseCookie,JsValueRef script,JsSourceContext sourceContext,WCHAR *url,
          JsParseScriptAttributes parseAttributes,JsValueRef parserState,bool parseOnly,
          JsValueRef *result)

{
  bool bVar1;
  JsErrorCode JVar2;
  ULONG UVar3;
  uint sourceIndex;
  int iVar4;
  JsrtContext *pJVar5;
  SourceContextInfo *sourceContextInfo;
  size_t len;
  ArrayBuffer *bufferVal;
  undefined4 extraout_var;
  ulong uVar6;
  SRCINFO local_b0;
  AutoNestedHandledExceptionType local_88 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  byte *local_68;
  byte *bytes;
  size_t cb;
  Utf8SourceInfo *utf8SourceInfo;
  WCHAR *local_48;
  ScriptContext *local_40;
  LoadScriptFlag local_34 [2];
  LoadScriptFlag loadScriptFlag;
  uchar *buffer;
  
  JVar2 = JsErrorNullArgument;
  if ((script != (JsValueRef)0x0) && (dwBgParseCookie != 0 || parserState != (JsValueRef)0x0)) {
    utf8SourceInfo = (Utf8SourceInfo *)sourceContext;
    local_48 = url;
    pJVar5 = JsrtContext::GetCurrent();
    sourceIndex = 0;
    JVar2 = JsErrorNoCurrentContext;
    if (pJVar5 != (JsrtContext *)0x0) {
      local_40 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_88,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      JVar2 = GetScriptBufferDetails(script,parseAttributes,local_34,(size_t *)&bytes,&local_68);
      if (JVar2 == JsNoError) {
        sourceContextInfo =
             Js::ScriptContext::GetSourceContextInfo
                       (local_40,(DWORD_PTR)utf8SourceInfo,(SimpleDataCacheWrapper *)0x0);
        if (sourceContextInfo == (SourceContextInfo *)0x0) {
          len = PAL_wcslen(local_48);
          sourceContextInfo =
               Js::ScriptContext::CreateSourceContextInfo
                         (local_40,(DWORD_PTR)utf8SourceInfo,local_48,len,
                          (SimpleDataCacheWrapper *)0x0,(char16 *)0x0,0);
        }
        uVar6 = (ulong)bytes >> ((local_34[0] & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None);
        Memory::Recycler::WBSetBit((char *)&local_b0);
        local_b0.sourceContextInfo.ptr = sourceContextInfo;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b0);
        local_b0.dlnHost = 0;
        local_b0.ulColumnHost = 0;
        local_b0.lnMinHost = 0;
        local_b0.ichMinHost = 0;
        local_b0.ichLimHost = (Type)uVar6;
        sourceIndex = 0;
        local_b0.ulCharOffset = 0;
        local_b0.moduleID = 0;
        local_b0.grfsi = 0;
        cb = 0;
        Js::ScriptContext::MakeUtf8SourceInfo
                  (local_40,local_68,(size_t)bytes,&local_b0,(Utf8SourceInfo **)&cb,local_34[0],
                   script);
        if (cb == 0) {
          JVar2 = JsErrorInvalidArgument;
        }
        else {
          UVar3 = Js::ScriptContext::GetParseFlags
                            (local_40,local_34[0],(Utf8SourceInfo *)cb,sourceContextInfo);
          *(ULONG *)(cb + 0xb0) = UVar3;
          sourceIndex = Js::ScriptContext::SaveSourceNoCopy
                                  (local_40,(Utf8SourceInfo *)cb,*(int *)(cb + 8),
                                   (local_34[0] & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None)
          ;
          JVar2 = JsNoError;
        }
      }
      else {
        sourceIndex = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_88);
    }
    if (JVar2 == JsNoError) {
      if (dwBgParseCookie == 0) {
        bVar1 = Js::VarIs<Js::ArrayBuffer>(parserState);
        if (!bVar1) {
          return JsErrorInvalidArgument;
        }
        bufferVal = Js::VarTo<Js::ArrayBuffer>(parserState);
        iVar4 = (*(bufferVal->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(bufferVal);
        buffer = (uchar *)CONCAT44(extraout_var,iVar4);
      }
      else {
        bufferVal = (ArrayBuffer *)0x0;
        buffer = (uchar *)0x0;
      }
      JVar2 = RunSerializedScriptCore<bool(*)(unsigned_long,void**,_JsParseScriptAttributes*),void(*)(unsigned_long)>
                        (DummyScriptLoadSourceCallbackForRunScriptWithParserState,
                         DummyScriptUnloadCallback,(JsSourceContext)utf8SourceInfo,buffer,bufferVal,
                         (JsSourceContext)utf8SourceInfo,local_48,dwBgParseCookie,parseOnly,true,
                         result,sourceIndex);
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API RunScriptWithParserStateCore(
    _In_ DWORD dwBgParseCookie,
    _In_ JsValueRef script,
    _In_ JsSourceContext sourceContext,
    _In_ WCHAR *url,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ JsValueRef parserState,
    _In_ bool parseOnly,
    _Out_ JsValueRef *result
)
{
    PARAM_NOT_NULL(script);

    if (dwBgParseCookie == 0)
    {
        PARAM_NOT_NULL(parserState);
    }

    uint sourceIndex = 0;

    JsErrorCode errorCode = ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        const byte* bytes;
        size_t cb;
        LoadScriptFlag loadScriptFlag;

        JsErrorCode errorCode = GetScriptBufferDetails(script, parseAttributes, &loadScriptFlag, &cb, &bytes);
        if (errorCode != JsNoError)
        {
            return errorCode;
        }

        SourceContextInfo* sourceContextInfo = scriptContext->GetSourceContextInfo(sourceContext, nullptr);

        if (sourceContextInfo == nullptr)
        {
            sourceContextInfo = scriptContext->CreateSourceContextInfo(sourceContext, url, wcslen(url), nullptr);
        }

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ?
            sizeof(utf8char_t) : sizeof(WCHAR);

        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };

        Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
        scriptContext->MakeUtf8SourceInfo(bytes, cb, &si, &utf8SourceInfo, loadScriptFlag, script);

        if (utf8SourceInfo == nullptr)
        {
            return JsErrorInvalidArgument;
        }

        ULONG grfscr = scriptContext->GetParseFlags(loadScriptFlag, utf8SourceInfo, sourceContextInfo);
        utf8SourceInfo->SetParseFlags(grfscr);

        if ((loadScriptFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_Utf8Source)
        {
            sourceIndex = scriptContext->SaveSourceNoCopy(utf8SourceInfo, static_cast<charcount_t>(utf8SourceInfo->GetCchLength()), /*isCesu8*/ true);
        }
        else
        {
            // TODO: This length may not be correct because we could have actually parsed a different number of characters
            sourceIndex = scriptContext->SaveSourceNoCopy(utf8SourceInfo, static_cast<charcount_t>(utf8SourceInfo->GetCchLength()), /* isCesu8*/ false);
        }

        return JsNoError;
    });

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    Js::ArrayBuffer* arrayBuffer = nullptr;
    byte* buffer = nullptr;
    if (dwBgParseCookie == 0)
    {
        if (!Js::VarIs<Js::ArrayBuffer>(parserState))
        {
            return JsErrorInvalidArgument;
        }

        arrayBuffer = Js::VarTo<Js::ArrayBuffer>(parserState);
        buffer = arrayBuffer->GetBuffer();
    }

    JsSerializedLoadScriptCallback dummy = DummyScriptLoadSourceCallbackForRunScriptWithParserState;

    return RunSerializedScriptCore(
        dummy, DummyScriptUnloadCallback,
        sourceContext, // use the same user provided sourceContext as scriptLoadSourceContext
        buffer, arrayBuffer, sourceContext, url, dwBgParseCookie, parseOnly, true, result, sourceIndex);
}